

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-accel.c
# Opt level: O0

void fy_accel_entry_remove(fy_accel *xl,fy_accel_entry *xle)

{
  uint uVar1;
  uint pos;
  fy_accel_entry *xle_local;
  fy_accel *xl_local;
  
  if ((xl != (fy_accel *)0x0) && (xle != (fy_accel_entry *)0x0)) {
    uVar1 = fy_accel_hash_to_pos(xl,xle + 1,xl->nbuckets);
    fy_accel_entry_list_del(xl->buckets + uVar1,xle);
    if (xl->count == 0) {
      __assert_fail("xl->count > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-accel.c"
                    ,0x115,"void fy_accel_entry_remove(struct fy_accel *, struct fy_accel_entry *)")
      ;
    }
    xl->count = xl->count - 1;
    free(xle);
  }
  return;
}

Assistant:

void
fy_accel_entry_remove(struct fy_accel *xl, struct fy_accel_entry *xle) {
    unsigned int pos;

    if (!xl || !xle)
        return;

    pos = fy_accel_hash_to_pos(xl, xle->hash, xl->nbuckets);

    fy_accel_entry_list_del(&xl->buckets[pos], xle);

    assert(xl->count > 0);
    xl->count--;

    free(xle);
}